

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::java::FileGenerator::Validate(FileGenerator *this,string *error)

{
  bool bVar1;
  FileOptions_OptimizeMode FVar2;
  LogMessage *this_00;
  LogMessage *other;
  string *in_RSI;
  undefined8 *in_RDI;
  LogMessage *in_stack_fffffffffffffed8;
  LogMessage *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  FileDescriptor *in_stack_ffffffffffffff00;
  ClassNameResolver *in_stack_ffffffffffffff08;
  bool local_1;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  bVar1 = ClassNameResolver::HasConflictingClassName
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                     (NameEquality)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  if (bVar1) {
    FileDescriptor::name_abi_cxx11_((FileDescriptor *)*in_RDI);
    std::__cxx11::string::assign(in_RSI);
    std::__cxx11::string::append((char *)in_RSI);
    std::__cxx11::string::append(in_RSI);
    std::__cxx11::string::append((char *)in_RSI);
    local_1 = false;
  }
  else {
    bVar1 = ClassNameResolver::HasConflictingClassName
                      (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8
                       ,(NameEquality)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    if (bVar1) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      FileDescriptor::name_abi_cxx11_((FileDescriptor *)*in_RDI);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffee0,(string *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      internal::LogMessage::~LogMessage((LogMessage *)0x530612);
    }
    FileDescriptor::options((FileDescriptor *)*in_RDI);
    FVar2 = FileOptions::optimize_for((FileOptions *)0x530652);
    if ((FVar2 == FileOptions_OptimizeMode_LITE_RUNTIME) &&
       ((*(byte *)((long)in_RDI + 0x93) & 1) == 0)) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      this_00 = internal::LogMessage::operator<<
                          (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      other = internal::LogMessage::operator<<(this_00,(char *)in_stack_fffffffffffffed8);
      internal::LogFinisher::operator=((LogFinisher *)this_00,other);
      internal::LogMessage::~LogMessage((LogMessage *)0x53072a);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool FileGenerator::Validate(std::string* error) {
  // Check that no class name matches the file's class name.  This is a common
  // problem that leads to Java compile errors that can be hard to understand.
  // It's especially bad when using the java_multiple_files, since we would
  // end up overwriting the outer class with one of the inner ones.
  if (name_resolver_->HasConflictingClassName(file_, classname_,
                                              NameEquality::EXACT_EQUAL)) {
    error->assign(file_->name());
    error->append(
        ": Cannot generate Java output because the file's outer class name, "
        "\"");
    error->append(classname_);
    error->append(
        "\", matches the name of one of the types declared inside it.  "
        "Please either rename the type or use the java_outer_classname "
        "option to specify a different outer class name for the .proto file.");
    return false;
  }
  // Similar to the check above, but ignore the case this time. This is not a
  // problem on Linux, but will lead to Java compile errors on Windows / Mac
  // because filenames are case-insensitive on those platforms.
  if (name_resolver_->HasConflictingClassName(
          file_, classname_, NameEquality::EQUAL_IGNORE_CASE)) {
    GOOGLE_LOG(WARNING)
        << file_->name() << ": The file's outer class name, \"" << classname_
        << "\", matches the name of one of the types declared inside it when "
        << "case is ignored. This can cause compilation issues on Windows / "
        << "MacOS. Please either rename the type or use the "
        << "java_outer_classname option to specify a different outer class "
        << "name for the .proto file to be safe.";
  }

  // Print a warning if optimize_for = LITE_RUNTIME is used.
  if (file_->options().optimize_for() == FileOptions::LITE_RUNTIME &&
      !options_.enforce_lite) {
    GOOGLE_LOG(WARNING)
        << "The optimize_for = LITE_RUNTIME option is no longer supported by "
        << "protobuf Java code generator and is ignored--protoc will always "
        << "generate full runtime code for Java. To use Java Lite runtime, "
        << "users should use the Java Lite plugin instead. See:\n"
        << "  "
           "https://github.com/protocolbuffers/protobuf/blob/master/java/"
           "lite.md";
  }
  return true;
}